

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator+(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  int tBase;
  int tBase_00;
  pointer pBVar1;
  pointer pBVar2;
  float tVal;
  Blade BStack_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar2 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar1 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  while ((pBVar2 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                    super__Vector_impl_data._M_finish &&
         (pBVar1 != (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                    super__Vector_impl_data._M_finish))) {
    tBase = pBVar2->mBase;
    tBase_00 = pBVar1->mBase;
    if (tBase < tBase_00) {
      Blade::Blade(&BStack_38,tBase,pBVar2->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&BStack_38);
      Blade::~Blade(&BStack_38);
      pBVar2 = pBVar2 + 1;
    }
    else {
      if (tBase == tBase_00) {
        tVal = pBVar2->mVal + pBVar1->mVal;
        if (1e-06 < ABS(tVal)) {
          Blade::Blade(&BStack_38,tBase,tVal);
          std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                    (__return_storage_ptr__,&BStack_38);
          Blade::~Blade(&BStack_38);
        }
        pBVar2 = pBVar2 + 1;
      }
      else {
        Blade::Blade(&BStack_38,tBase_00,pBVar1->mVal);
        std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                  (__return_storage_ptr__,&BStack_38);
        Blade::~Blade(&BStack_38);
      }
      pBVar1 = pBVar1 + 1;
    }
  }
  for (; pBVar1 != (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pBVar1 = pBVar1 + 1) {
    if (1e-06 < ABS(pBVar1->mVal)) {
      Blade::Blade(&BStack_38,pBVar1->mBase,pBVar1->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&BStack_38);
      Blade::~Blade(&BStack_38);
    }
  }
  for (; pBVar2 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pBVar2 = pBVar2 + 1) {
    if (1e-06 < ABS(pBVar2->mVal)) {
      Blade::Blade(&BStack_38,pBVar2->mBase,pBVar2->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&BStack_38);
      Blade::~Blade(&BStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator+(Clifford A, Clifford B) {
	Clifford C; 
	idx a=A.begin();
	idx b=B.begin();
	while(a!=A.end()&&b!=B.end())
	{
		//switch
		int d=(a->mBase)-(b->mBase);
		if(d<0)
		{C.push_back(Blade(a->mBase,a->mVal));a++;}
		else if(d>0)
		{C.push_back(Blade(b->mBase,b->mVal));b++;}
		else if(0==d)
		{
			float Val=a->mVal+b->mVal;
			if(fabs(Val)>Error2){C.push_back(Blade(a->mBase,Val));}
			a++;b++;
		}
	}
	while(b!=B.end())
	{	
		if(fabs(b->mVal)>Error2){C.push_back(Blade(b->mBase,b->mVal));}
		b++;
	}
	while(a!=A.end())
	{	
		if(fabs(a->mVal)>Error2){C.push_back(Blade(a->mBase,a->mVal));}
		a++;
	}
  return C;
}